

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  pointer paVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint iIndex;
  aiColor4D vTemp;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *local_38;
  
  local_38 = &mesh->mVertexColors;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
            (local_38,(ulong)iNumVertices);
  local_50 = 0;
LAB_003e5100:
  do {
    pcVar3 = this->filePtr;
    if (*pcVar3 == '*') {
      this->filePtr = pcVar3 + 1;
      iVar5 = strncmp("MESH_VERTCOL",pcVar3 + 1,0xc);
      if (iVar5 == 0) {
        bVar2 = pcVar3[0xd];
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar3 + 0xe;
          if (bVar2 == 0) {
            pcVar7 = pcVar3 + 0xd;
          }
          this->filePtr = pcVar7;
          local_48 = 0;
          uStack_40 = 0x3f80000000000000;
          ParseLV4MeshFloatTriple(this,(ai_real *)&local_48,&local_4c);
          if (local_4c < iNumVertices) {
            paVar1 = (local_38->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start + local_4c;
            paVar1->r = (float)(undefined4)local_48;
            paVar1->g = (float)local_48._4_4_;
            paVar1->b = (float)(undefined4)uStack_40;
            paVar1->a = (float)uStack_40._4_4_;
          }
          else {
            LogWarning(this,"Vertex color has an invalid index. It will be ignored");
          }
          goto LAB_003e5100;
        }
      }
    }
    pbVar4 = (byte *)this->filePtr;
    bVar2 = *pbVar4;
    uVar6 = (uint)bVar2;
    if (bVar2 == 0x7b) {
      local_50 = local_50 + 1;
    }
    else if (bVar2 == 0x7d) {
      local_50 = local_50 + -1;
      if (local_50 == 0) {
        this->filePtr = (char *)(pbVar4 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar6 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_CVERTEX_LIST chunk (Level 3)")
      ;
    }
    if (((uVar6 < 0xe) && ((0x3401U >> (uVar6 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar4 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCListBlock(unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mVertexColors.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTCOL" ,12))
            {
                aiColor4D vTemp;
                vTemp.a = 1.0f;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.r,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Vertex color has an invalid index. It will be ignored");
                }
                else mesh.mVertexColors[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CVERTEX_LIST");
    }
    return;
}